

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetFloatConst(ConstantManager *this,float val)

{
  TypeManager *this_00;
  Type *type;
  Constant *pCVar1;
  FloatProxy<float> v;
  FloatProxy<float> local_34;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  this_00 = IRContext::get_type_mgr(this->ctx_);
  type = TypeManager::GetFloatType(this_00);
  local_34.data_ = (uint_type)val;
  utils::FloatProxy<float>::GetWords
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,&local_34);
  pCVar1 = GetConstant(this,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  return pCVar1;
}

Assistant:

const Constant* ConstantManager::GetFloatConst(float val) {
  Type* float_type = context()->get_type_mgr()->GetFloatType();
  utils::FloatProxy<float> v(val);
  const Constant* c = GetConstant(float_type, v.GetWords());
  return c;
}